

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O1

void __thiscall
shaping_clipper::apply_window
          (shaping_clipper *this,float *in_frame,float *out_frame,bool add_to_out_frame)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  long lVar4;
  float fVar5;
  
  iVar1 = this->size;
  if (0 < (long)iVar1) {
    iVar2 = this->max_oversample;
    pfVar3 = (this->window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      fVar5 = *pfVar3 * in_frame[lVar4];
      if (add_to_out_frame) {
        fVar5 = fVar5 + out_frame[lVar4];
      }
      out_frame[lVar4] = fVar5;
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + iVar2;
    } while (iVar1 != lVar4);
  }
  return;
}

Assistant:

void shaping_clipper::apply_window(const float* in_frame, float* out_frame, const bool add_to_out_frame) {
    const float* window = this->window.data();
    int total_samples = this->size;
    int window_stride = this->max_oversample;
    for (int i = 0; i < total_samples; i++) {
        if (add_to_out_frame) {
            out_frame[i] += in_frame[i] * *window;
        } else {
            out_frame[i] = in_frame[i] * *window;
        }
        window += window_stride;
    }
}